

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O0

void quantize(__m256i *qp,__m256i *c,int16_t *iscan_ptr,int log_scale,tran_low_t *qcoeff,
             tran_low_t *dqcoeff,__m256i *eob)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  uint in_ECX;
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined1 (*in_stack_00000008) [32];
  __m256i nz;
  __m256i zc;
  __m256i zero;
  __m256i iscan;
  __m128i hi;
  __m128i lo;
  __m128i zr;
  __m128i isc;
  __m256i dq;
  __m256i mask;
  __m256i abs_s;
  __m256i qp_hi;
  __m256i q_hi;
  __m256i q_lo;
  __m256i q;
  __m256i abs_coeff;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  ulong uStack_6b8;
  ulong uStack_678;
  
  auVar3 = vpabsd_avx2(*in_RSI);
  auVar4 = vpaddd_avx2(auVar3,*in_RDI);
  auVar5 = vpmuldq_avx2(auVar4,in_RDI[1]);
  auVar4 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
  auVar6 = vpsrlq_avx2(in_RDI[1],ZEXT416(0x20));
  auVar4 = vpmuldq_avx2(auVar4,auVar6);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x10 - in_ECX));
  auVar4 = vpsrlq_avx2(auVar4,ZEXT416(0x10 - in_ECX));
  auVar4 = vpsllq_avx2(auVar4,ZEXT416(0x20));
  auVar4 = vpor_avx2(auVar5,auVar4);
  auVar3 = vpslld_avx2(auVar3,ZEXT416(in_ECX + 1));
  auVar3 = vpcmpgtd_avx2(in_RDI[2],auVar3);
  auVar3 = vpandn_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(auVar3,in_RDI[2]);
  auVar4 = vpsrad_avx2(auVar4,ZEXT416(in_ECX));
  auVar3 = vpsignd_avx2(auVar3,*in_RSI);
  auVar4 = vpsignd_avx2(auVar4,*in_RSI);
  local_740 = auVar3._0_8_;
  uStack_738 = auVar3._8_8_;
  uStack_730 = auVar3._16_8_;
  uStack_728 = auVar3._24_8_;
  *in_R8 = local_740;
  in_R8[1] = uStack_738;
  in_R8[2] = uStack_730;
  in_R8[3] = uStack_728;
  local_800 = auVar4._0_8_;
  uStack_7f8 = auVar4._8_8_;
  uStack_7f0 = auVar4._16_8_;
  uStack_7e8 = auVar4._24_8_;
  *in_R9 = local_800;
  in_R9[1] = uStack_7f8;
  in_R9[2] = uStack_7f0;
  in_R9[3] = uStack_7e8;
  uStack_678 = SUB168(ZEXT816(0),4);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_678;
  auVar2 = vpunpcklwd_avx(*in_RDX,auVar1 << 0x40);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uStack_678;
  auVar1 = vpunpckhwd_avx(*in_RDX,auVar7 << 0x40);
  local_840 = auVar1._0_8_;
  uStack_838 = auVar1._8_8_;
  uStack_6b8 = SUB328(ZEXT832(0),4);
  auVar3 = vpcmpeqd_avx2(auVar4,ZEXT832(uStack_6b8) << 0x40);
  auVar3 = vpcmpeqd_avx2(auVar3,ZEXT832(uStack_6b8) << 0x40);
  auVar4._16_8_ = local_840;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_838;
  auVar4 = vpsubd_avx2(auVar4,auVar3);
  auVar3 = vpand_avx2(auVar4,auVar3);
  auVar3 = vpmaxsd_avx2(auVar3,*in_stack_00000008);
  *in_stack_00000008 = auVar3;
  return;
}

Assistant:

static inline void quantize(const int16_t *iscan_ptr,
                            const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                            tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                            const __m128i *round0, const __m128i *round1,
                            const __m128i *quant0, const __m128i *quant1,
                            const __m128i *dequant0, const __m128i *dequant1,
                            const __m128i *thr0, const __m128i *thr1,
                            __m128i *eob) {
  __m128i coeff0, coeff1;
  // Do DC and first 15 AC
  read_coeff(coeff_ptr, n_coeffs, &coeff0, &coeff1);

  // Poor man's sign extract
  const __m128i coeff0_sign = _mm_srai_epi16(coeff0, 15);
  const __m128i coeff1_sign = _mm_srai_epi16(coeff1, 15);
  __m128i qcoeff0 = _mm_xor_si128(coeff0, coeff0_sign);
  __m128i qcoeff1 = _mm_xor_si128(coeff1, coeff1_sign);
  qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
  qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);
  const __m128i mask0 = _mm_or_si128(_mm_cmpgt_epi16(qcoeff0, *thr0),
                                     _mm_cmpeq_epi16(qcoeff0, *thr0));
  const __m128i mask1 = _mm_or_si128(_mm_cmpgt_epi16(qcoeff1, *thr1),
                                     _mm_cmpeq_epi16(qcoeff1, *thr1));
  const int nzflag = _mm_movemask_epi8(mask0) | _mm_movemask_epi8(mask1);

  if (nzflag) {
    qcoeff0 = _mm_adds_epi16(qcoeff0, *round0);
    qcoeff1 = _mm_adds_epi16(qcoeff1, *round1);
    const __m128i qtmp0 = _mm_mulhi_epi16(qcoeff0, *quant0);
    const __m128i qtmp1 = _mm_mulhi_epi16(qcoeff1, *quant1);

    // Reinsert signs
    qcoeff0 = _mm_xor_si128(qtmp0, coeff0_sign);
    qcoeff1 = _mm_xor_si128(qtmp1, coeff1_sign);
    qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
    qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);

    write_qcoeff(&qcoeff0, &qcoeff1, qcoeff_ptr, n_coeffs);

    coeff0 = _mm_mullo_epi16(qcoeff0, *dequant0);
    coeff1 = _mm_mullo_epi16(qcoeff1, *dequant1);

    write_qcoeff(&coeff0, &coeff1, dqcoeff_ptr, n_coeffs);

    const __m128i zero = _mm_setzero_si128();
    // Scan for eob
    const __m128i zero_coeff0 = _mm_cmpeq_epi16(coeff0, zero);
    const __m128i zero_coeff1 = _mm_cmpeq_epi16(coeff1, zero);
    const __m128i nzero_coeff0 = _mm_cmpeq_epi16(zero_coeff0, zero);
    const __m128i nzero_coeff1 = _mm_cmpeq_epi16(zero_coeff1, zero);
    const __m128i iscan0 =
        _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs));
    const __m128i iscan1 =
        _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs) + 1);
    // Add one to convert from indices to counts
    const __m128i iscan0_nz = _mm_sub_epi16(iscan0, nzero_coeff0);
    const __m128i iscan1_nz = _mm_sub_epi16(iscan1, nzero_coeff1);
    const __m128i eob0 = _mm_and_si128(iscan0_nz, nzero_coeff0);
    const __m128i eob1 = _mm_and_si128(iscan1_nz, nzero_coeff1);
    const __m128i eob2 = _mm_max_epi16(eob0, eob1);
    *eob = _mm_max_epi16(*eob, eob2);
  } else {
    write_zero(qcoeff_ptr, n_coeffs);
    write_zero(dqcoeff_ptr, n_coeffs);
  }
}